

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_mul(m256v *A,m256v *B,m256v *AB_out)

{
  uint8_t b;
  uint8_t a;
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = AB_out->n_row;
  if (0 < iVar2) {
    uVar1 = (ulong)(uint)AB_out->n_col;
    lVar4 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar5 = 0;
        do {
          if (A->n_col < 1) {
            a = '\0';
          }
          else {
            lVar3 = 0;
            a = '\0';
            do {
              b = gf256_mul(A->e[lVar3 + A->rstride * lVar4],B->e[lVar5 + B->rstride * lVar3]);
              a = gf256_add(a,b);
              lVar3 = lVar3 + 1;
            } while (lVar3 < A->n_col);
          }
          AB_out->e[lVar5 + AB_out->rstride * lVar4] = a;
          lVar5 = lVar5 + 1;
          uVar1 = (ulong)AB_out->n_col;
        } while (lVar5 < (long)uVar1);
        iVar2 = AB_out->n_row;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}